

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractspinbox.cpp
# Opt level: O2

bool __thiscall QAbstractSpinBox::event(QAbstractSpinBox *this,QEvent *event)

{
  ushort uVar1;
  QAbstractSpinBoxPrivate *this_00;
  bool bVar2;
  char cVar3;
  undefined1 uVar4;
  long in_FS_OFFSET;
  QPointF QVar5;
  QPointF local_38;
  QPoint local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QAbstractSpinBoxPrivate **)(this + 8);
  uVar1 = *(ushort *)(event + 8);
  if (uVar1 - 0x7f < 3) {
    QVar5 = QSinglePointEvent::position((QSinglePointEvent *)event);
    local_38.yp = QVar5.yp;
    local_38.xp = QVar5.xp;
    local_28 = QPointF::toPoint(&local_38);
    QAbstractSpinBoxPrivate::updateHoverControl(this_00,&local_28);
LAB_0043e5d7:
    bVar2 = QWidget::event((QWidget *)this,event);
  }
  else {
    if (uVar1 == 0x25) {
LAB_0043e5cb:
      (**(code **)(*(long *)&this_00->super_QWidgetPrivate + 0x100))(this_00);
      goto LAB_0043e5d7;
    }
    if (uVar1 != 0x33) {
      if (uVar1 == 0x53) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
          uVar4 = (**(code **)(*(long *)&this_00->edit->super_QWidget + 0x28))(this_00->edit,event);
          return (bool)uVar4;
        }
        goto LAB_0043e642;
      }
      if (uVar1 == 0x5a) goto LAB_0043e5cb;
      if ((uVar1 == 100) || (uVar1 == 0x61)) {
        (this_00->cachedSizeHint).wd.m_i = -1;
        (this_00->cachedSizeHint).ht.m_i = -1;
        (this_00->cachedMinimumSizeHint).wd.m_i = -1;
        (this_00->cachedMinimumSizeHint).ht.m_i = -1;
      }
      goto LAB_0043e5d7;
    }
    cVar3 = (**(code **)(*(long *)&this_00->edit->super_QWidget + 0x28))(this_00->edit,event);
    bVar2 = true;
    if (cVar3 == '\0') goto LAB_0043e5d7;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return bVar2;
  }
LAB_0043e642:
  __stack_chk_fail();
}

Assistant:

bool QAbstractSpinBox::event(QEvent *event)
{
    Q_D(QAbstractSpinBox);
    switch (event->type()) {
    case QEvent::FontChange:
    case QEvent::StyleChange:
        d->cachedSizeHint = d->cachedMinimumSizeHint = QSize();
        break;
    case QEvent::ApplicationLayoutDirectionChange:
    case QEvent::LayoutDirectionChange:
        d->updateEditFieldGeometry();
        break;
    case QEvent::HoverEnter:
    case QEvent::HoverLeave:
    case QEvent::HoverMove:
        d->updateHoverControl(static_cast<const QHoverEvent *>(event)->position().toPoint());
        break;
    case QEvent::ShortcutOverride:
        if (d->edit->event(event))
            return true;
        break;
#ifdef QT_KEYPAD_NAVIGATION
    case QEvent::EnterEditFocus:
    case QEvent::LeaveEditFocus:
        if (QApplicationPrivate::keypadNavigationEnabled()) {
            const bool b = d->edit->event(event);
            d->edit->setSelection(d->edit->displayText().size() - d->suffix.size(),0);
            if (event->type() == QEvent::LeaveEditFocus)
                emit editingFinished();
            if (b)
                return true;
        }
        break;
#endif
    case QEvent::InputMethod:
        return d->edit->event(event);
    default:
        break;
    }
    return QWidget::event(event);
}